

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_base64.cpp
# Opt level: O0

void Omega_h::base64::anon_unknown_0::decode_4(char *in,uchar *out,size_t nout)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint local_28;
  byte local_24;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  uint i;
  uchar val [4];
  size_t nout_local;
  uchar *out_local;
  char *in_local;
  
  local_28 = 0;
  _i = nout;
  while( true ) {
    if (3 < local_28) {
      uVar2 = U<unsigned_char>(local_24);
      uVar3 = U<int>(2);
      uVar4 = U<int>(0xfc);
      uVar5 = U<unsigned_char>(local_23);
      uVar6 = U<int>(4);
      uVar7 = U<int>(3);
      uVar1 = UC<unsigned_int>(uVar2 << ((byte)uVar3 & 0x1f) & uVar4 |
                               uVar5 >> ((byte)uVar6 & 0x1f) & uVar7);
      *out = uVar1;
      if (1 < _i) {
        uVar2 = U<unsigned_char>(local_23);
        uVar3 = U<int>(4);
        uVar4 = U<int>(0xf0);
        uVar5 = U<unsigned_char>(local_22);
        uVar6 = U<int>(2);
        uVar7 = U<int>(0xf);
        uVar1 = UC<unsigned_int>(uVar2 << ((byte)uVar3 & 0x1f) & uVar4 |
                                 uVar5 >> ((byte)uVar6 & 0x1f) & uVar7);
        out[1] = uVar1;
        if (2 < _i) {
          uVar2 = U<unsigned_char>(local_22);
          uVar3 = U<int>(6);
          uVar4 = U<int>(0xc0);
          uVar5 = U<unsigned_char>(local_21);
          uVar6 = U<int>(0);
          uVar7 = U<int>(0x3f);
          uVar1 = UC<unsigned_int>(uVar2 << ((byte)uVar3 & 0x1f) & uVar4 |
                                   uVar5 >> ((byte)uVar6 & 0x1f) & uVar7);
          out[2] = uVar1;
        }
      }
      return;
    }
    uVar2 = U<char>(in[local_28]);
    (&local_24)[local_28] = (anonymous_namespace)::char_to_value[uVar2];
    if (0x3f < (&local_24)[local_28]) break;
    local_28 = local_28 + 1;
  }
  fail("assertion %s failed at %s +%d\n","val[i] < 64",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_base64.cpp"
       ,0x4b);
}

Assistant:

void decode_4(char const* in, unsigned char* out, std::size_t nout = 3) {
  unsigned char val[4];
  for (unsigned i = 0; i < 4; ++i) {
    val[i] = char_to_value[U(in[i])];
    OMEGA_H_CHECK(val[i] < 64);
  }
  /* cast it all !
   * (technically this should all be run as
   *  unsigned char, but apparently it gets pushed
   *  up to int if we try that, so run it all as unsigned
   *  and cast back which we know is safe) */
  out[0] =
      UC(((U(val[0]) << U(2)) & U(0xFC)) | ((U(val[1]) >> U(4)) & U(0x03)));
  if (nout < 2) return;
  out[1] =
      UC(((U(val[1]) << U(4)) & U(0xF0)) | ((U(val[2]) >> U(2)) & U(0x0F)));
  if (nout < 3) return;
  out[2] =
      UC(((U(val[2]) << U(6)) & U(0xC0)) | ((U(val[3]) >> U(0)) & U(0x3F)));
}